

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
::BaseDictionary(BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                 *this,AllocatorType *allocator,int capacity)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  nullptr_t local_30;
  nullptr_t local_28;
  int local_1c;
  AllocatorType *pAStack_18;
  int capacity_local;
  AllocatorType *allocator_local;
  BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  local_28 = (nullptr_t)0x0;
  local_1c = capacity;
  pAStack_18 = allocator;
  allocator_local = (AllocatorType *)this;
  Memory::WriteBarrierPtr<int>::WriteBarrierPtr(&this->buckets,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::WeakRefValueDictionaryEntry<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
  ::WriteBarrierPtr(&this->entries,&local_30);
  this->alloc = pAStack_18;
  this->size = 0;
  this->bucketCount = 0;
  this->count = 0;
  this->freeCount = 0;
  this->modFunctionIndex = 0x4b;
  if (pAStack_18 == (AllocatorType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x8e,"(allocator)","allocator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->stats = (Type)0x0;
  if (0 < local_1c) {
    Initialize(this,local_1c);
  }
  return;
}

Assistant:

BaseDictionary(AllocatorType* allocator, int capacity = 0)
            : buckets (nullptr),
            size(0),
            bucketCount(0),
            entries(nullptr),
            count(0),
            freeCount(0),
            alloc(allocator),
            modFunctionIndex(UNKNOWN_MOD_INDEX)
        {
            Assert(allocator);
#if PROFILE_DICTIONARY
            stats = nullptr;
#endif
            // If initial capacity is negative or 0, lazy initialization on
            // the first insert operation is performed.
            if (capacity > 0)
            {
                Initialize(capacity);
            }
        }